

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall sentencepiece::NormalizerSpec::NormalizerSpec(NormalizerSpec *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NormalizerSpec_002126f0;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  if (scc_info_NormalizerSpec_sentencepiece_5fmodel_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    google::protobuf::internal::InitSCCImpl
              (&scc_info_NormalizerSpec_sentencepiece_5fmodel_2eproto.base);
  }
  (this->name_).tagged_ptr_.ptr_ = &google::protobuf::internal::fixed_address_empty_string;
  (this->precompiled_charsmap_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string;
  (this->normalization_rule_tsv_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string;
  this->add_dummy_prefix_ = true;
  this->remove_extra_whitespaces_ = true;
  this->escape_whitespaces_ = true;
  return;
}

Assistant:

NormalizerSpec::NormalizerSpec(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.NormalizerSpec)
}